

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

OPJ_UINT32 opj_bio_read(opj_bio_t *bio,OPJ_UINT32 n)

{
  OPJ_UINT32 OVar1;
  uint local_1c;
  int local_18;
  OPJ_UINT32 v;
  OPJ_INT32 i;
  OPJ_UINT32 n_local;
  opj_bio_t *bio_local;
  
  if (n != 0) {
    local_1c = 0;
    for (local_18 = n - 1; -1 < local_18; local_18 = local_18 + -1) {
      OVar1 = opj_bio_getbit(bio);
      local_1c = OVar1 << ((byte)local_18 & 0x1f) | local_1c;
    }
    return local_1c;
  }
  __assert_fail("(n > 0U)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/bio.c"
                ,0xae,"OPJ_UINT32 opj_bio_read(opj_bio_t *, OPJ_UINT32)");
}

Assistant:

OPJ_UINT32 opj_bio_read(opj_bio_t *bio, OPJ_UINT32 n)
{
    OPJ_INT32 i;
    OPJ_UINT32 v;

    assert((n > 0U) /* && (n <= 32U)*/);
#ifdef OPJ_UBSAN_BUILD
    /* This assert fails for some corrupted images which are gracefully rejected */
    /* Add this assert only for ubsan build. */
    /* This is the condition for overflow not to occur below which is needed because of OPJ_NOSANITIZE */
    assert(n <= 32U);
#endif
    v = 0U;
    for (i = (OPJ_INT32)n - 1; i >= 0; i--) {
        v |= opj_bio_getbit(bio) <<
             i; /* can't overflow, opj_bio_getbit returns 0 or 1 */
    }
    return v;
}